

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O2

Texture * __thiscall
Assimp::LWOImporter::SetupNewTextureLWOB(LWOImporter *this,TextureList *list,uint size)

{
  _List_node_base *p_Var1;
  _Alloc_hider __haystack;
  char *pcVar2;
  Logger *this_00;
  string type;
  string local_1d8;
  char *local_1b8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  
  LWO::Texture::Texture((Texture *)&local_198);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::push_back
            (list,(Texture *)&local_198);
  LWO::Texture::~Texture((Texture *)&local_198);
  p_Var1 = (list->super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>).
           _M_impl._M_node.super__List_node_base._M_prev;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  GetS0(this,&local_1d8,size);
  __haystack._M_p = local_1d8._M_dataplus._M_p;
  pcVar2 = strstr(local_1d8._M_dataplus._M_p,"Image Map");
  if (pcVar2 == (char *)0x0) {
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[35]>(&local_198,(char (*) [35])"LWOB: Unsupported legacy texture: ");
    std::operator<<((ostream *)&local_198,(string *)&local_1d8);
    std::__cxx11::stringbuf::str();
    Logger::error(this_00,local_1b8[0]);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  }
  else {
    pcVar2 = strstr(__haystack._M_p,"Planar");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(__haystack._M_p,"Cylindrical");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(__haystack._M_p,"Spherical");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strstr(__haystack._M_p,"Cubic");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strstr(__haystack._M_p,"Front");
            if (pcVar2 != (char *)0x0) {
              *(undefined4 *)&p_Var1[7]._M_next = 4;
            }
          }
          else {
            *(undefined4 *)&p_Var1[7]._M_next = 3;
          }
        }
        else {
          *(undefined4 *)&p_Var1[7]._M_next = 2;
        }
      }
      else {
        *(undefined4 *)&p_Var1[7]._M_next = 1;
      }
    }
    else {
      *(undefined4 *)&p_Var1[7]._M_next = 0;
    }
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  return (Texture *)(p_Var1 + 1);
}

Assistant:

LWO::Texture* LWOImporter::SetupNewTextureLWOB(LWO::TextureList& list,unsigned int size)
{
    list.push_back(LWO::Texture());
    LWO::Texture* tex = &list.back();

    std::string type;
    GetS0(type,size);
    const char* s = type.c_str();

    if(strstr(s, "Image Map"))
    {
        // Determine mapping type
        if(strstr(s, "Planar"))
            tex->mapMode = LWO::Texture::Planar;
        else if(strstr(s, "Cylindrical"))
            tex->mapMode = LWO::Texture::Cylindrical;
        else if(strstr(s, "Spherical"))
            tex->mapMode = LWO::Texture::Spherical;
        else if(strstr(s, "Cubic"))
            tex->mapMode = LWO::Texture::Cubic;
        else if(strstr(s, "Front"))
            tex->mapMode = LWO::Texture::FrontProjection;
    }
    else
    {
        // procedural or gradient, not supported
        ASSIMP_LOG_ERROR_F("LWOB: Unsupported legacy texture: ", type);
    }

    return tex;
}